

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O2

int nni_msgq_init(nni_msgq **mqp,uint cap)

{
  nni_msgq *mtx;
  nni_msg **ppnVar1;
  int iVar2;
  
  mtx = (nni_msgq *)nni_zalloc(0x98);
  iVar2 = 2;
  if (mtx != (nni_msgq *)0x0) {
    ppnVar1 = (nni_msg **)nni_zalloc((ulong)(cap + 2) << 3);
    mtx->mq_msgs = ppnVar1;
    if (ppnVar1 == (nni_msg **)0x0) {
      nni_free(mtx,0x98);
    }
    else {
      nni_aio_list_init(&mtx->mq_aio_putq);
      nni_aio_list_init(&mtx->mq_aio_getq);
      nni_mtx_init((nni_mtx *)mtx);
      nni_pollable_init(&mtx->mq_recvable);
      nni_pollable_init(&mtx->mq_sendable);
      mtx->mq_cap = cap;
      mtx->mq_alloc = cap + 2;
      mtx->mq_len = 0;
      mtx->mq_get = 0;
      *(undefined8 *)((long)&mtx->mq_get + 1) = 0;
      *mqp = mtx;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
nni_msgq_init(nni_msgq **mqp, unsigned cap)
{
	struct nni_msgq *mq;
	unsigned         alloc;

	// We allocate 2 extra cells in the fifo.  One to accommodate a
	// waiting writer when cap == 0. (We can "briefly" move the message
	// through.)  This lets us behave the same as unbuffered Go channels.
	// The second cell is to permit pushback later, e.g. for REQ to stash
	// a message back at the end to do a retry.
	alloc = cap + 2;

	if ((mq = NNI_ALLOC_STRUCT(mq)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((mq->mq_msgs = nni_zalloc(sizeof(nng_msg *) * alloc)) == NULL) {
		NNI_FREE_STRUCT(mq);
		return (NNG_ENOMEM);
	}
	nni_aio_list_init(&mq->mq_aio_putq);
	nni_aio_list_init(&mq->mq_aio_getq);
	nni_mtx_init(&mq->mq_lock);
	nni_pollable_init(&mq->mq_recvable);
	nni_pollable_init(&mq->mq_sendable);

	mq->mq_cap    = cap;
	mq->mq_alloc  = alloc;
	mq->mq_len    = 0;
	mq->mq_get    = 0;
	mq->mq_put    = 0;
	mq->mq_closed = 0;
	*mqp          = mq;

	return (0);
}